

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Block2Node
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int BlockNum,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Node)

{
  undefined8 *puVar1;
  pointer pbVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  size_t sVar7;
  char cVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  char buf [100];
  stringstream temp_1;
  stringstream temp;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  pcVar9 = blocks.buffer[BlockNum].data + 1;
  cVar8 = blocks.buffer[BlockNum].data[0];
  Node->NodeState = cVar8;
  iVar6 = this->N;
  if (1 < iVar6) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      (Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar11] = *pcVar9;
      if ((Node->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] == '1') {
        if (this->Data_Type == '2') {
          std::__cxx11::stringstream::stringstream(local_340);
          local_3a8 = *(undefined8 *)(pcVar9 + 1);
          uStack_3a0 = *(undefined8 *)(pcVar9 + 9);
          local_398 = *(undefined8 *)(pcVar9 + 0x11);
          uStack_390 = *(undefined8 *)(pcVar9 + 0x19);
          sVar7 = strlen((char *)&local_3a8);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)&local_3a8,sVar7);
          std::operator>>((istream *)local_340,
                          (string *)
                          ((long)&(((Node->k).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar10));
          std::__cxx11::stringstream::~stringstream(local_340);
          std::ios_base::~ios_base(aiStack_2c0);
        }
        else {
          pbVar2 = (Node->k).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = *(undefined8 *)(pcVar9 + 1);
          uVar4 = *(undefined8 *)(pcVar9 + 9);
          uVar5 = *(undefined8 *)(pcVar9 + 0x19);
          puVar1 = (undefined8 *)((long)&pbVar2->field_2 + lVar10);
          *puVar1 = *(undefined8 *)(pcVar9 + 0x11);
          puVar1[1] = uVar5;
          puVar1 = (undefined8 *)((long)&(pbVar2->_M_dataplus)._M_p + lVar10);
          *puVar1 = uVar3;
          puVar1[1] = uVar4;
        }
      }
      pcVar9 = pcVar9 + 0x21;
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      lVar11 = lVar11 + 1;
      iVar6 = this->N;
      lVar10 = lVar10 + 0x20;
    } while (lVar11 < (long)iVar6 + -1);
    cVar8 = Node->NodeState;
  }
  if (1 < iVar6 && cVar8 == '1') {
    lVar10 = 0;
    do {
      (Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10].BlockNum = *(int *)pcVar9;
      pcVar9 = pcVar9 + 4;
      lVar10 = lVar10 + 1;
      iVar6 = this->N;
    } while (lVar10 < (long)iVar6 + -1);
  }
  if (0 < iVar6) {
    lVar10 = 0;
    do {
      (Node->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10].FileOff = *(int *)pcVar9;
      pcVar9 = pcVar9 + 4;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->N);
  }
  (Node->parent).FileOff = *(int *)pcVar9;
  return;
}

Assistant:

void BpTree<K>::Block2Node(int BlockNum, IndexNode<K>& Node) {
	int i;
	char buf[100];
	char* p = blocks.buffer[BlockNum].data;
	memcpy(&Node.NodeState, p, sizeof(char));
	p += sizeof(char);
	for (i = 0; i < N - 1; i++) {
		stringstream temp;
		memcpy(&Node.v[i], p, sizeof(char));
		p += sizeof(char);
		if (Node.v[i] == '1') {
			if (this->Data_Type == STRING) {
				stringstream temp;
				memcpy(buf, p, sizeof(string));
				temp << buf;
				temp >> Node.k[i];
			}
			else {
				memcpy(reinterpret_cast<char*>(&Node.k[i]), p, sizeof(K));
			}
		}
		p += sizeof(K);
	}
	if (Node.NodeState == LEAF) {
		for (i = 0; i < N - 1; i++) {
			memcpy(reinterpret_cast<char*>(&Node.p[i].BlockNum), p, sizeof(int));
			p += sizeof(int);
		}
	}
	for (i = 0; i < N; i++) {
		memcpy(reinterpret_cast<char*>(&Node.p[i].FileOff), p, sizeof(int));
		p += sizeof(int);
	}
	memcpy(reinterpret_cast<char*>(&Node.parent.FileOff), p, sizeof(int));
}